

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray *
QByteArray::number(QByteArray *__return_storage_ptr__,double n,char format,int precision)

{
  char cVar1;
  DoubleForm form;
  undefined7 in_register_00000031;
  
  cVar1 = format + ' ';
  if (0x19 < (int)CONCAT71(in_register_00000031,format) - 0x41U) {
    cVar1 = format;
  }
  form = DFSignificantDigits;
  if (cVar1 != 'g') {
    form = (uint)(cVar1 != 'e');
  }
  qdtoAscii(__return_storage_ptr__,n,form,precision,(byte)(format + 0xbfU) < 0x1a);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::number(double n, char format, int precision)
{
    QLocaleData::DoubleForm form = QLocaleData::DFDecimal;

    switch (QtMiscUtils::toAsciiLower(format)) {
        case 'f':
            form = QLocaleData::DFDecimal;
            break;
        case 'e':
            form = QLocaleData::DFExponent;
            break;
        case 'g':
            form = QLocaleData::DFSignificantDigits;
            break;
        default:
#if defined(QT_CHECK_RANGE)
            qWarning("QByteArray::setNum: Invalid format char '%c'", format);
#endif
            break;
    }

    return qdtoAscii(n, form, precision, isUpperCaseAscii(format));
}